

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

String * __thiscall
Json::(anonymous_namespace)::valueToString_abi_cxx11_
          (String *__return_storage_ptr__,_anonymous_namespace_ *this,double value,
          bool useSpecialFloats,uint precision,PrecisionType precisionType)

{
  pointer pcVar1;
  uint uVar2;
  long lVar3;
  size_type sVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  pointer pcVar6;
  pointer pcVar7;
  char *pcVar8;
  allocator<char> local_41;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  double local_38;
  
  if ((ulong)ABS(value) < 0x7ff0000000000000) {
    local_40 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
    local_38 = value;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'$');
    pcVar8 = "%.*f";
    if (precision == 0) {
      pcVar8 = "%.*g";
    }
    do {
      uVar2 = snprintf((__return_storage_ptr__->_M_dataplus)._M_p,
                       __return_storage_ptr__->_M_string_length,pcVar8,local_38,
                       CONCAT71(in_register_00000011,useSpecialFloats) & 0xffffffff);
      if ((int)uVar2 < 0) {
        __assert_fail("len >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/springkim[P]cip/src/jsoncpp.cpp"
                      ,0x1057,
                      "String Json::(anonymous namespace)::valueToString(double, bool, unsigned int, PrecisionType)"
                     );
      }
      uVar5 = __return_storage_ptr__->_M_string_length;
      std::__cxx11::string::resize
                ((ulong)__return_storage_ptr__,((char)uVar2 + '\x01') - (uVar2 < uVar5));
    } while (uVar5 <= uVar2);
    pcVar8 = (__return_storage_ptr__->_M_dataplus)._M_p;
    for (sVar4 = __return_storage_ptr__->_M_string_length; sVar4 != 0; sVar4 = sVar4 - 1) {
      if (*pcVar8 == ',') {
        *pcVar8 = '.';
      }
      pcVar8 = pcVar8 + 1;
    }
    __return_storage_ptr__->_M_string_length =
         (long)pcVar8 - (long)(__return_storage_ptr__->_M_dataplus)._M_p;
    *pcVar8 = '\0';
    if (precision == 1) {
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
      sVar4 = __return_storage_ptr__->_M_string_length;
      pcVar7 = pcVar1 + sVar4;
      if (sVar4 != 0) {
        do {
          pcVar6 = pcVar7;
          sVar4 = sVar4 - 1;
          pcVar7 = pcVar6;
          if ((pcVar6[-1] != '0') || (pcVar7 = pcVar1, sVar4 == 0)) goto LAB_00112ce5;
        } while ((sVar4 != 0) && (pcVar7 = pcVar6 + -1, pcVar6[-2] != '.'));
        pcVar7 = pcVar6;
        if (pcVar6[-2] != '.') {
          pcVar7 = pcVar1;
        }
      }
LAB_00112ce5:
      __return_storage_ptr__->_M_string_length = (long)pcVar7 - (long)pcVar1;
      *pcVar7 = '\0';
    }
    lVar3 = std::__cxx11::string::find((char)__return_storage_ptr__,0x2e);
    if ((lVar3 == -1) &&
       (lVar3 = std::__cxx11::string::find((char)__return_storage_ptr__,0x65), lVar3 == -1)) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  else {
    uVar5 = 0;
    if (!NAN(value)) {
      uVar5 = (ulong)((0.0 <= value) + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               anon_unknown_17::valueToString::reps[(byte)((byte)this ^ 1)][uVar5],&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

String valueToString(double value, bool useSpecialFloats,
                     unsigned int precision, PrecisionType precisionType) {
  // Print into the buffer. We need not request the alternative representation
  // that always has a decimal point because JSON doesn't distinguish the
  // concepts of reals and integers.
  if (!isfinite(value)) {
    static const char* const reps[2][3] = {{"NaN", "-Infinity", "Infinity"},
                                           {"null", "-1e+9999", "1e+9999"}};
    return reps[useSpecialFloats ? 0 : 1]
               [isnan(value) ? 0 : (value < 0) ? 1 : 2];
  }

  String buffer(size_t(36), '\0');
  while (true) {
    int len = jsoncpp_snprintf(
        &*buffer.begin(), buffer.size(),
        (precisionType == PrecisionType::significantDigits) ? "%.*g" : "%.*f",
        precision, value);
    assert(len >= 0);
    auto wouldPrint = static_cast<size_t>(len);
    if (wouldPrint >= buffer.size()) {
      buffer.resize(wouldPrint + 1);
      continue;
    }
    buffer.resize(wouldPrint);
    break;
  }

  buffer.erase(fixNumericLocale(buffer.begin(), buffer.end()), buffer.end());

  // strip the zero padding from the right
  if (precisionType == PrecisionType::decimalPlaces) {
    buffer.erase(fixZerosInTheEnd(buffer.begin(), buffer.end()), buffer.end());
  }

  // try to ensure we preserve the fact that this was given to us as a double on
  // input
  if (buffer.find('.') == buffer.npos && buffer.find('e') == buffer.npos) {
    buffer += ".0";
  }
  return buffer;
}